

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base32.cpp
# Opt level: O3

void __thiscall Base32_ThirtyTwo_Test::TestBody(Base32_ThirtyTwo_Test *this)

{
  uint128 val;
  char *pcVar1;
  AssertHelper in_stack_ffffffffffffffb8;
  internal in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  pstore::base32::convert<unsigned_int>(&local_30,0x20);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&stack0xffffffffffffffc0,"convert (32U)","\"ab\"",&local_30,
             (char (*) [3])"ab");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (in_stack_ffffffffffffffc0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_base32.cpp"
               ,0x33,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb8,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb8);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  val.v_._8_1_ = in_stack_ffffffffffffffc0;
  val.v_._0_8_ = in_stack_ffffffffffffffb8.data_;
  val.v_._9_7_ = in_stack_ffffffffffffffc1;
  pstore::base32::convert<pstore::uint128>(&local_30,(base32 *)&DAT_00000020,val);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&stack0xffffffffffffffc0,"convert (uint128{32U})","\"ab\"",&local_30,
             (char (*) [3])"ab");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (in_stack_ffffffffffffffc0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_base32.cpp"
               ,0x34,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb8,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb8);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TEST (Base32, ThirtyTwo) {
    using pstore::uint128;
    using pstore::base32::convert;
    EXPECT_EQ (convert (32U), "ab");
    EXPECT_EQ (convert (uint128{32U}), "ab");
}